

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O1

bool __thiscall QtMWidgets::Scroller::eventFilter(Scroller *this,QObject *obj,QEvent *event)

{
  double dVar1;
  short sVar2;
  uint uVar3;
  ScrollerPrivate *pSVar4;
  QVariantAnimation *pQVar5;
  int iVar6;
  undefined1 uVar7;
  QPoint QVar8;
  long lVar9;
  QPoint QVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  QMouseEvent *e;
  ulong uVar15;
  double dVar16;
  undefined4 in_XMM1_Da;
  uint in_XMM1_Db;
  double dVar17;
  QPoint newPos;
  QPoint local_58;
  QVariant local_50;
  
  pSVar4 = (this->d).d;
  if (pSVar4->target != obj) {
    uVar7 = QObject::eventFilter(&this->super_QObject,(QEvent *)obj);
    return (bool)uVar7;
  }
  sVar2 = *(short *)(event + 8);
  if (sVar2 == 5) {
    if (pSVar4->mousePressed == true) {
      lVar9 = QElapsedTimer::elapsed();
      dVar16 = (double)QEventPoint::position();
      pSVar4 = (this->d).d;
      iVar12 = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16) -
               (pSVar4->pos).xp;
      iVar13 = (int)((double)(((ulong)in_XMM1_Db & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                    (double)CONCAT44(in_XMM1_Db,in_XMM1_Da)) - (pSVar4->pos).yp;
      iVar6 = -iVar12;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      pSVar4->distance = pSVar4->distance + iVar14 + iVar6;
      dVar16 = (double)QEventPoint::position();
      QVar10.xp = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16);
      QVar10.yp = (int)((double)(((ulong)in_XMM1_Db & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                       (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
      ((this->d).d)->pos = QVar10;
      if (5 < (uint)(iVar14 + iVar6)) {
        pSVar4 = (this->d).d;
        pSVar4->xVelocity = (double)iVar12 / ((double)lVar9 / 1000.0);
        pSVar4->yVelocity = (double)iVar13 / ((double)lVar9 / 1000.0);
        QElapsedTimer::restart();
      }
    }
  }
  else if (sVar2 == 3) {
    lVar9 = QElapsedTimer::elapsed();
    pSVar4 = (this->d).d;
    if (lVar9 <= pSVar4->maxPause) {
      uVar3 = pSVar4->distance;
      uVar11 = -uVar3;
      if (0 < (int)uVar3) {
        uVar11 = uVar3;
      }
      if (pSVar4->startDragDistance <= uVar11) {
        dVar16 = pSVar4->xVelocity;
        uVar15 = -(ulong)(dVar16 < -dVar16);
        dVar17 = (double)(~uVar15 & (ulong)dVar16 | (ulong)-dVar16 & uVar15);
        if (((double)pSVar4->minVelocity <= dVar17) ||
           (dVar1 = pSVar4->yVelocity, uVar15 = -(ulong)(dVar1 < -dVar1),
           (double)pSVar4->minVelocity <= (double)(~uVar15 & (ulong)dVar1 | (ulong)-dVar1 & uVar15))
           ) {
          if (pSVar4->maxVelocity != 0) {
            dVar1 = (double)pSVar4->maxVelocity;
            if (dVar1 < dVar17) {
              pSVar4->xVelocity =
                   (qreal)(~-(ulong)(0.0 < dVar16) & (ulong)-dVar1 |
                          -(ulong)(0.0 < dVar16) & (ulong)dVar1);
            }
            dVar16 = pSVar4->yVelocity;
            uVar15 = -(ulong)(dVar16 < -dVar16);
            if (dVar1 < (double)(~uVar15 & (ulong)dVar16 | (ulong)-dVar16 & uVar15)) {
              pSVar4->yVelocity =
                   (qreal)(~-(ulong)(0.0 < dVar16) & (ulong)-dVar1 |
                          (ulong)dVar1 & -(ulong)(0.0 < dVar16));
            }
          }
          dVar16 = (pSVar4->xVelocity * (double)pSVar4->scrollTime) / 1000.0;
          local_58.xp = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar16) + (pSVar4->pos).xp;
          dVar16 = ((double)pSVar4->scrollTime * pSVar4->yVelocity) / 1000.0;
          local_58.yp = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) +
                             dVar16) + (pSVar4->pos).yp;
          pQVar5 = pSVar4->scrollAnimation;
          QVariant::QVariant(&local_50,&pSVar4->pos);
          QVariantAnimation::setStartValue((QVariant *)pQVar5);
          QVariant::~QVariant(&local_50);
          pQVar5 = ((this->d).d)->scrollAnimation;
          QVariant::QVariant(&local_50,&local_58);
          QVariantAnimation::setEndValue((QVariant *)pQVar5);
          QVariant::~QVariant(&local_50);
          aboutToStart(this);
          QAbstractAnimation::start(((this->d).d)->scrollAnimation,0);
        }
      }
    }
    QElapsedTimer::invalidate();
    ((this->d).d)->mousePressed = false;
  }
  else if (sVar2 == 2) {
    dVar16 = (double)QEventPoint::position();
    QVar8.xp = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16);
    QVar8.yp = (int)((double)(((ulong)in_XMM1_Db & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                    (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
    ((this->d).d)->pos = QVar8;
    pSVar4 = (this->d).d;
    pSVar4->mousePressed = true;
    pSVar4->distance = 0;
    pSVar4->xVelocity = 0.0;
    pSVar4->yVelocity = 0.0;
    QAbstractAnimation::stop();
    QElapsedTimer::start();
  }
  return false;
}

Assistant:

bool
Scroller::eventFilter( QObject * obj, QEvent * event )
{
	if( obj == d->target )
	{
		if( event->type() == QEvent::MouseButtonPress )
		{
			QMouseEvent * e = static_cast< QMouseEvent* > ( event );

			d->pos = e->pos();
			d->mousePressed = true;
			d->xVelocity = 0.0;
			d->yVelocity = 0.0;
			d->distance = 0;

			d->scrollAnimation->stop();

			d->elapsed.start();
		}
		else if( event->type() == QEvent::MouseButtonRelease )
		{
			if( d->elapsed.elapsed() <= d->maxPause &&
				(uint) qAbs( d->distance ) >= d->startDragDistance )
			{
				if( qAbs( d->xVelocity ) >= d->minVelocity ||
					qAbs( d->yVelocity ) >= d->minVelocity )
				{
					if( d->maxVelocity > 0 )
					{
						if( qAbs( d->xVelocity ) > d->maxVelocity )
						{
							if( d->xVelocity > 0 )
								d->xVelocity = (qreal) d->maxVelocity;
							else
								d->xVelocity = - (qreal) d->maxVelocity;
						}

						if( qAbs( d->yVelocity ) > d->maxVelocity )
						{
							if( d->yVelocity > 0 )
								d->yVelocity = (qreal) d->maxVelocity;
							else
								d->yVelocity = - (qreal) d->maxVelocity;
						}
					}

					const QPoint newPos = QPoint(
						d->pos.x() + qRound( d->xVelocity * d->scrollTime / 1000 ),
						d->pos.y() + qRound( d->yVelocity * d->scrollTime / 1000 ) );

					d->scrollAnimation->setStartValue( d->pos );
					d->scrollAnimation->setEndValue( newPos );

					emit aboutToStart();

					d->scrollAnimation->start();
				}
			}

			d->elapsed.invalidate();
			d->mousePressed = false;
		}
		else if( event->type() == QEvent::MouseMove )
		{
			if( d->mousePressed )
			{
				QMouseEvent * e = static_cast< QMouseEvent* > ( event );

				const qreal time = (qreal) d->elapsed.elapsed() / 1000.0;

				const QPoint p = e->pos() - d->pos;

				d->distance += p.manhattanLength();

				d->pos = e->pos();

				if( p.manhattanLength() > 5 )
				{
					d->xVelocity = (qreal) p.x() / time;
					d->yVelocity = (qreal) p.y() / time;

					d->elapsed.restart();
				}
			}
		}

		return false;
	}
	else
		return QObject::eventFilter( obj, event );
}